

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

object * jessilib::deserialize_object
                   (object *__return_storage_ptr__,istream *in_stream,string *in_format,
                   text_encoding in_encoding)

{
  element_type *peVar1;
  shared_ptr<jessilib::parser> local_38;
  text_encoding local_24;
  string *psStack_20;
  text_encoding in_encoding_local;
  string *in_format_local;
  istream *in_stream_local;
  
  local_24 = in_encoding;
  psStack_20 = in_format;
  in_format_local = (string *)in_stream;
  in_stream_local = (istream *)__return_storage_ptr__;
  get_parser((jessilib *)&local_38,in_format);
  peVar1 = std::__shared_ptr_access<jessilib::parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<jessilib::parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_38);
  (*peVar1->_vptr_parser[2])(__return_storage_ptr__,peVar1,in_format_local,(ulong)local_24);
  std::shared_ptr<jessilib::parser>::~shared_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

object deserialize_object(std::istream& in_stream, const std::string& in_format, text_encoding in_encoding) {
	return get_parser(in_format)->deserialize_bytes(in_stream, in_encoding);
}